

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> * __thiscall
MlmWrap::getHighFreqList
          (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *__return_storage_ptr__,
          MlmWrap *this)

{
  int iVar1;
  char *__s1;
  byte *s;
  size_t n;
  zmsg_t *msg;
  zframe_t *f;
  HighFreqDataType hf;
  zmsg_t *local_108;
  zframe_t *local_100;
  string local_f8;
  allocator local_d8 [32];
  HighFreqDataType local_b8;
  
  local_108 = czhelp_zmsg_create("s","HFDTSLIST",0);
  std::mutex::lock(&this->actormutex);
  zactor_send(this->actor,&local_108);
  local_108 = zactor_recv(this->actor);
  pthread_mutex_unlock((pthread_mutex_t *)&this->actormutex);
  __s1 = zmsg_popstr(local_108);
  iVar1 = strcmp(__s1,"HFDTSLIST");
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_f8,"Error retrieving high freq list\n",local_d8);
    error((string *)&local_b8,this,&local_f8);
    std::operator<<((ostream *)&std::cerr,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  (__return_storage_ptr__->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = zmsg_pop(local_108);
  while (local_100 != (zframe_t *)0x0) {
    HighFreqDataType::HighFreqDataType(&local_b8);
    s = zframe_data(local_100);
    n = zframe_size(local_100);
    binarydata::binarydata((binarydata *)local_d8,(char *)s,n);
    HighFreqDataType::decode(&local_b8,(binarydata *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::push_back
              (__return_storage_ptr__,&local_b8);
    zframe_destroy(&local_100);
    local_100 = zmsg_pop(local_108);
    HighFreqDataType::~HighFreqDataType(&local_b8);
  }
  zmsg_destroy(&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HighFreqDataType> MlmWrap::getHighFreqList(){
    zmsg_t *msg = czhelp_zmsg_create("s", hfdtslist, NULL);
    {
        std::lock_guard<std::mutex> lock(actormutex);
        zactor_send(actor, &msg);
        msg = zactor_recv(actor);
    }
    char* first = zmsg_popstr(msg);
    if(!streq(first, hfdtslist)){
        std::cerr << error("Error retrieving high freq list\n");
    }
    std::vector<HighFreqDataType> hfdts;
    zframe_t *f = zmsg_pop(msg);
    while(f){
        HighFreqDataType hf;
        hf.decode(binarydata((char*)zframe_data(f), zframe_size(f)));
        hfdts.push_back(hf);
        zframe_destroy(&f);
        f = zmsg_pop(msg);
    }
    zmsg_destroy(&msg);
    return hfdts;
}